

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.cpp
# Opt level: O3

void __thiscall EthernetLink::EthernetLink(EthernetLink *this,char *name)

{
  Link::Link(&this->super_Link,name);
  (this->super_Link).super_Entity._vptr_Entity = (_func_int **)&PTR__EthernetLink_00127550;
  (this->_interfaces).super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_interfaces).super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_interfaces).super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_contending).super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_contending).super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_contending).super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   ((long)&(this->_contending).
           super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 7) = 0;
  this->_contention_period = 10;
  this->_message = (Message *)0x0;
  MetaSim::Event::Event(&(this->_end_contention_evt).super_Event,8);
  (this->_end_contention_evt).super_Event._vptr_Event = (_func_int **)&PTR__Event_001275b8;
  (this->_end_contention_evt)._obj = this;
  (this->_end_contention_evt)._fun = (Pmemfun)onEndContention;
  *(undefined8 *)&(this->_end_contention_evt).field_0x98 = 0;
  MetaSim::Event::Event(&(this->_collision_evt).super_Event,8);
  (this->_collision_evt).super_Event._vptr_Event = (_func_int **)&PTR__Event_001275b8;
  (this->_collision_evt)._obj = this;
  (this->_collision_evt)._fun = (Pmemfun)onCollision;
  *(undefined8 *)&(this->_collision_evt).field_0x98 = 0;
  MetaSim::Event::Event(&(this->_end_transmission_evt).super_Event,8);
  (this->_end_transmission_evt).super_Event._vptr_Event = (_func_int **)&PTR__Event_001275b8;
  (this->_end_transmission_evt)._obj = this;
  (this->_end_transmission_evt)._fun = (Pmemfun)onEndTransmission;
  *(undefined8 *)&(this->_end_transmission_evt).field_0x98 = 0;
  return;
}

Assistant:

EthernetLink::EthernetLink(const char *name) 
    : Link(name), _interfaces(), _contending(), 
      _isBusy(false),
      _isContending(false),
      _isCollision(false),
      _contention_period(10),
      _message(0),
      _end_contention_evt(this, &EthernetLink::onEndContention),
      _collision_evt(this, &EthernetLink::onCollision),
      _end_transmission_evt(this, &EthernetLink::onEndTransmission)
{
    //register_handler(_end_contention_evt, this, &EthernetLink::onEndContention);
    //register_handler(_collision_evt, this, &EthernetLink::onCollision);
    //register_handler(_end_transmission_evt, this, &EthernetLink::onEndTransmission);
}